

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableBeginRow(ImGuiTable *table)

{
  ImGuiWindow *pIVar1;
  ImU32 color;
  float local_1c;
  float next_y1;
  ImGuiWindow *window;
  ImGuiTable *table_local;
  
  pIVar1 = table->InnerWindow;
  if (((table->IsInsideRow ^ 0xffU) & 1) != 0) {
    table->CurrentRow = table->CurrentRow + 1;
    table->CurrentColumn = -1;
    table->RowBgColor[1] = 0x1000000;
    table->RowBgColor[0] = 0x1000000;
    table->RowCellDataCurrent = -1;
    table->IsInsideRow = true;
    local_1c = table->RowPosY2;
    if ((table->CurrentRow == 0) && ('\0' < table->FreezeRowsCount)) {
      local_1c = (table->OuterRect).Min.y;
      (pIVar1->DC).CursorPos.y = local_1c;
    }
    table->RowPosY2 = local_1c;
    table->RowPosY1 = local_1c;
    table->RowTextBaseline = 0.0;
    table->RowIndentOffsetX = (pIVar1->DC).Indent.x - table->HostIndentX;
    (pIVar1->DC).PrevLineTextBaseOffset = 0.0;
    (pIVar1->DC).CursorMaxPos.y = local_1c;
    if ((*(uint *)&table->field_0x90 & 1) != 0) {
      color = GetColorU32(0x2a,1.0);
      TableSetBgColor(1,color,-1);
      if (table->CurrentRow == 0) {
        table->IsUsingHeaders = true;
      }
    }
    return;
  }
  __assert_fail("!table->IsInsideRow",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O0/_deps/imgui-src/imgui_tables.cpp"
                ,0x642,"void ImGui::TableBeginRow(ImGuiTable *)");
}

Assistant:

void ImGui::TableBeginRow(ImGuiTable* table)
{
    ImGuiWindow* window = table->InnerWindow;
    IM_ASSERT(!table->IsInsideRow);

    // New row
    table->CurrentRow++;
    table->CurrentColumn = -1;
    table->RowBgColor[0] = table->RowBgColor[1] = IM_COL32_DISABLE;
    table->RowCellDataCurrent = -1;
    table->IsInsideRow = true;

    // Begin frozen rows
    float next_y1 = table->RowPosY2;
    if (table->CurrentRow == 0 && table->FreezeRowsCount > 0)
        next_y1 = window->DC.CursorPos.y = table->OuterRect.Min.y;

    table->RowPosY1 = table->RowPosY2 = next_y1;
    table->RowTextBaseline = 0.0f;
    table->RowIndentOffsetX = window->DC.Indent.x - table->HostIndentX; // Lock indent
    window->DC.PrevLineTextBaseOffset = 0.0f;
    window->DC.CursorMaxPos.y = next_y1;

    // Making the header BG color non-transparent will allow us to overlay it multiple times when handling smooth dragging.
    if (table->RowFlags & ImGuiTableRowFlags_Headers)
    {
        TableSetBgColor(ImGuiTableBgTarget_RowBg0, GetColorU32(ImGuiCol_TableHeaderBg));
        if (table->CurrentRow == 0)
            table->IsUsingHeaders = true;
    }
}